

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunMemoryToRegister(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValueType VVar1;
  ScopeData *pSVar2;
  VariableData *container;
  TypeBase *pTVar3;
  VmConstant *pVVar4;
  VmBlock *pVVar5;
  VmBlock *pVVar6;
  SynIdentifier *pSVar7;
  VmInstruction *this;
  VmValue *this_00;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ArrayView<VmInstruction_*> phiNodes_00;
  long lVar12;
  bool bVar13;
  VmValueType VVar14;
  SynBase *pSVar15;
  VmInstruction *pVVar16;
  Allocator *pAVar17;
  VmBlock *pVVar18;
  char *pcVar19;
  _func_int *p_Var20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  SmallArray<VmValue_*,_4U> *this_01;
  VmValue *pVVar27;
  ulong uVar28;
  VmType type;
  VmType VVar29;
  SmallArray<VmBlock_*,_32U> worklist;
  SmallArray<VmInstruction_*,_32U> phiNodes;
  SmallArray<VmInstruction_*,_32U> unusedPhiNodes;
  SmallArray<VmValue_*,_32U> stack;
  VmValue *in_stack_fffffffffffffb08;
  VmValueType local_4c0;
  undefined4 uStack_494;
  SmallArray<VmBlock_*,_32U> local_490;
  SmallArray<VmInstruction_*,_32U> local_378;
  SmallArray<VmInstruction_*,_32U> local_260;
  SmallArray<VmValue_*,_32U> local_148;
  
  if ((((value != (VmValue *)0x0) && (value->typeID == 4)) && (value[1].source != (SynBase *)0x0))
     && (value[1]._vptr_VmValue != (_func_int **)0x0)) {
    VmFunction::UpdateDominatorTree((VmFunction *)value,module,true);
    pSVar2 = *(ScopeData **)&value[1].typeID;
    if ((pSVar2 != (ScopeData *)0x0) && (pSVar2 != ctx->globalScope)) {
      for (pSVar15 = value[1].source; pSVar15 != (SynBase *)0x0;
          pSVar15 = (SynBase *)pSVar15[3]._vptr_SynBase) {
        pSVar15[7].pos.end = (char *)0x0;
      }
      if ((pSVar2->allVariables).count != 0) {
        uVar28 = 0;
        do {
          container = (pSVar2->allVariables).data[uVar28];
          if ((container->isAlloca != true) || ((container->users).count != 0)) {
            bVar13 = IsMemberScope(container->scope);
            if (bVar13) {
              __assert_fail("!IsMemberScope(variable->scope)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x17c0,
                            "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
            }
            bVar13 = IsGlobalScope(container->scope);
            if (bVar13) {
              __assert_fail("!IsGlobalScope(variable->scope)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x17c1,
                            "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
            }
            bVar13 = HasAddressTaken(container);
            if (!bVar13) {
              VVar29 = GetVmType(ctx,container->type);
              pTVar3 = container->type;
              if (((pTVar3 == ctx->typeInt) || (pTVar3 == ctx->typeDouble)) ||
                 (local_4c0 = VVar29.type, pTVar3 == ctx->typeLong || local_4c0 == VM_TYPE_POINTER))
              {
                pAVar17 = module->allocator;
                local_490.data = local_490.little;
                local_490.count = 0;
                local_490.max = 0x20;
                for (p_Var20 = value[1]._vptr_VmValue[0x3e]; iVar8 = (int)uVar28,
                    p_Var20 != (_func_int *)0x0; p_Var20 = *(_func_int **)(p_Var20 + 0x10)) {
                  if (*(VariableData **)(p_Var20 + 8) == container) goto LAB_001a09ba;
                }
                uVar23 = 0;
                if ((VariableData *)value[1]._vptr_VmValue[0x40] == container) {
LAB_001a09ba:
                  local_490.little[0] = (VmBlock *)value[1].source;
                  local_490.little[0]->hasAssignmentForId = iVar8 + 1;
                  local_490.count = 1;
                  local_490.max = 0x20;
                  uVar23 = 1;
                }
                uVar21 = (container->users).count;
                local_490.allocator = pAVar17;
                if (uVar21 != 0) {
                  uVar26 = 0;
                  do {
                    pVVar4 = (container->users).data[uVar26];
                    uVar22 = (pVVar4->super_VmValue).users.count;
                    if (uVar22 != 0) {
                      uVar25 = 0;
                      do {
                        pVVar27 = (pVVar4->super_VmValue).users.data[uVar25];
                        if (((pVVar27 != (VmValue *)0x0) && (pVVar27->typeID == 2)) &&
                           (*(int *)&pVVar27[1]._vptr_VmValue - 8U < 7)) {
                          if (pVVar27[1].type.type == VM_TYPE_VOID) {
LAB_001a10b1:
                            pcVar19 = 
                            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                            ;
LAB_001a10dd:
                            __assert_fail("index < count",
                                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                          ,0x199,pcVar19);
                          }
                          if ((VmConstant *)**(undefined8 **)&pVVar27[1].typeID == pVVar4) {
                            uVar21 = (uint)uVar23;
                            if (uVar21 == 0) {
                              pVVar18 = (VmBlock *)pVVar27[1].users.data;
                            }
                            else {
                              pVVar18 = (VmBlock *)pVVar27[1].users.data;
                              uVar24 = 1;
                              do {
                                lVar12 = uVar24 - 1;
                                if (uVar23 <= uVar24) break;
                                uVar24 = uVar24 + 1;
                              } while (local_490.data[lVar12] != pVVar18);
                              if (local_490.data[lVar12] == pVVar18) goto LAB_001a0af3;
                            }
                            pVVar18->hasAssignmentForId = iVar8 + 1;
                            if (uVar21 == local_490.max) {
                              SmallArray<VmBlock_*,_32U>::grow(&local_490,uVar21);
                            }
                            if (local_490.data == (VmBlock **)0x0) goto LAB_001a113c;
                            uVar24 = local_490._8_8_ & 0xffffffff;
                            uVar23 = (ulong)(local_490.count + 1);
                            local_490.count = local_490.count + 1;
                            local_490.data[uVar24] = (VmBlock *)pVVar27[1].users.data;
                            uVar22 = (pVVar4->super_VmValue).users.count;
                          }
                        }
LAB_001a0af3:
                        uVar25 = uVar25 + 1;
                      } while (uVar25 < uVar22);
                      uVar21 = (container->users).count;
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 < uVar21);
                  pAVar17 = module->allocator;
                }
                module->currentFunction = (VmFunction *)value;
                local_378.data = local_378.little;
                local_378.count = 0;
                local_378.max = 0x20;
                local_378.allocator = pAVar17;
                if ((int)uVar23 == 0) {
                  uVar21 = 0;
                }
                else {
                  do {
                    uVar21 = (int)uVar23 - 1;
                    uVar23 = (ulong)uVar21;
                    pVVar18 = local_490.data[uVar23];
                    local_490.count = uVar21;
                    if ((pVVar18->dominanceFrontier).count != 0) {
                      uVar23 = 0;
                      do {
                        pVVar5 = (pVVar18->dominanceFrontier).data[uVar23];
                        if (pVVar5->hasPhiNodeForId <= uVar28) {
                          module->currentBlock = pVVar5;
                          pVVar5->insertPoint = (VmInstruction *)0x0;
                          type.structType = (TypeBase *)0x4d;
                          type._0_8_ = VVar29.structType;
                          pVVar16 = anon_unknown.dwarf_107107::CreateInstruction
                                              ((anon_unknown_dwarf_107107 *)module,(VmModule *)0x0,
                                               VVar29._0_8_,type,VM_INST_LOAD_BYTE,(VmValue *)0x0,
                                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                               in_stack_fffffffffffffb08);
                          if ((pVVar5->predecessors).count != 0) {
                            this_01 = &pVVar16->arguments;
                            uVar26 = 0;
                            do {
                              uVar21 = (pVVar16->arguments).count;
                              if (uVar21 == (pVVar16->arguments).max) {
                                SmallArray<VmValue_*,_4U>::grow(this_01,uVar21);
                              }
                              if (this_01->data == (VmValue **)0x0) {
LAB_001a10e7:
                                pcVar19 = 
                                "void SmallArray<VmValue *, 4>::push_back(const T &) [T = VmValue *, N = 4]"
                                ;
                                goto LAB_001a10fc;
                              }
                              uVar21 = (pVVar16->arguments).count;
                              uVar22 = uVar21 + 1;
                              (pVVar16->arguments).count = uVar22;
                              this_01->data[uVar21] = (VmValue *)0x0;
                              if ((pVVar5->predecessors).count <= uVar26) {
LAB_001a10c8:
                                pcVar19 = 
                                "T &SmallArray<VmBlock *, 4>::operator[](unsigned int) [T = VmBlock *, N = 4]"
                                ;
                                goto LAB_001a10dd;
                              }
                              pVVar6 = (pVVar5->predecessors).data[uVar26];
                              if (uVar22 == (pVVar16->arguments).max) {
                                SmallArray<VmValue_*,_4U>::grow(this_01,uVar22);
                              }
                              if (this_01->data == (VmValue **)0x0) goto LAB_001a10e7;
                              uVar21 = (pVVar16->arguments).count;
                              (pVVar16->arguments).count = uVar21 + 1;
                              this_01->data[uVar21] = &pVVar6->super_VmValue;
                              if ((pVVar5->predecessors).count <= uVar26) goto LAB_001a10c8;
                              VmValue::AddUse(&(pVVar5->predecessors).data[uVar26]->super_VmValue,
                                              &pVVar16->super_VmValue);
                              uVar26 = uVar26 + 1;
                            } while (uVar26 < (pVVar5->predecessors).count);
                          }
                          pSVar7 = container->name;
                          uVar9 = *(undefined4 *)((long)&(pSVar7->name).begin + 4);
                          uVar10 = *(undefined4 *)&(pSVar7->name).end;
                          uVar11 = *(undefined4 *)((long)&(pSVar7->name).end + 4);
                          *(undefined4 *)&(pVVar16->super_VmValue).comment.begin =
                               *(undefined4 *)&(pSVar7->name).begin;
                          *(undefined4 *)((long)&(pVVar16->super_VmValue).comment.begin + 4) = uVar9
                          ;
                          *(undefined4 *)&(pVVar16->super_VmValue).comment.end = uVar10;
                          *(undefined4 *)((long)&(pVVar16->super_VmValue).comment.end + 4) = uVar11;
                          if (local_378.count == local_378.max) {
                            SmallArray<VmInstruction_*,_32U>::grow(&local_378,local_378.count);
                          }
                          if (local_378.data == (VmInstruction **)0x0) goto LAB_001a1125;
                          uVar26 = local_378._8_8_ & 0xffffffff;
                          local_378.count = local_378.count + 1;
                          local_378.data[uVar26] = pVVar16;
                          pVVar5->insertPoint = pVVar5->lastInstruction;
                          module->currentBlock = (VmBlock *)0x0;
                          pVVar5->hasPhiNodeForId = iVar8 + 1U;
                          if (pVVar5->hasAssignmentForId <= uVar28) {
                            pVVar5->hasAssignmentForId = iVar8 + 1U;
                            if (local_490.count == local_490.max) {
                              SmallArray<VmBlock_*,_32U>::grow(&local_490,local_490.count);
                            }
                            if (local_490.data == (VmBlock **)0x0) goto LAB_001a113c;
                            uVar26 = local_490._8_8_ & 0xffffffff;
                            local_490.count = local_490.count + 1;
                            local_490.data[uVar26] = pVVar5;
                          }
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 < (pVVar18->dominanceFrontier).count);
                      uVar23 = local_490._8_8_ & 0xffffffff;
                    }
                  } while ((int)uVar23 != 0);
                  pAVar17 = module->allocator;
                  uVar21 = local_378.count;
                }
                local_148.data = local_148.little;
                local_148.count = 0;
                local_148.max = 0x20;
                phiNodes_00._12_4_ = uStack_494;
                phiNodes_00.count = uVar21;
                phiNodes_00.data = local_378.data;
                local_148.allocator = pAVar17;
                RenameMemoryToRegister
                          (ctx,module,(VmBlock *)value[1].source,&local_148,container,phiNodes_00);
                local_260.allocator = module->allocator;
                local_260.data = local_260.little;
                local_260.count = 0;
                local_260.max = 0x20;
                if (local_378.count != 0) {
                  uVar23 = 0;
                  do {
                    pVVar16 = local_378.data[uVar23];
                    uVar21 = *(uint *)&value[2].hasKnownNonSimpleUse;
                    *(uint *)&value[2].hasKnownNonSimpleUse = uVar21 + 1;
                    bVar13 = IsPhiUsed(pVVar16,uVar21);
                    if (!bVar13) {
                      if (local_260.count == local_260.max) {
                        SmallArray<VmInstruction_*,_32U>::grow(&local_260,local_260.count);
                      }
                      if (local_260.data == (VmInstruction **)0x0) goto LAB_001a1125;
                      uVar26 = local_260._8_8_ & 0xffffffff;
                      local_260.count = local_260.count + 1;
                      local_260.data[uVar26] = pVVar16;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar23 < (local_378._8_8_ & 0xffffffff));
                  if (local_260.count != 0) {
                    uVar23 = 0;
                    uVar21 = local_260.count;
                    do {
                      pVVar16 = local_260.data[uVar23];
                      (pVVar16->super_VmValue).canBeRemoved = false;
                      uVar22 = (pVVar16->super_VmValue).users.count;
                      if (uVar22 != 0) {
                        do {
                          pVVar27 = (pVVar16->super_VmValue).users.data[uVar22 - 1];
                          if ((pVVar27 == (VmValue *)0x0) || (pVVar27->typeID != 2)) {
                            pVVar27 = (VmValue *)0x0;
                          }
                          if (*(int *)&pVVar27[1]._vptr_VmValue != 0x4d) {
                            __assert_fail("user->cmd == VM_INST_PHI",
                                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                          ,0x183e,
                                          "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)"
                                         );
                          }
                          VVar14 = pVVar27[1].type.type;
                          if (VVar14 != VM_TYPE_VOID) {
                            uVar26 = 0;
                            do {
                              uVar25 = (ulong)VVar14;
                              if (uVar25 <= uVar26 + 1) goto LAB_001a10b1;
                              this = *(VmInstruction **)(*(long *)&pVVar27[1].typeID + uVar26 * 8);
                              if (this == pVVar16) {
                                this_00 = *(VmValue **)
                                           (*(long *)&pVVar27[1].typeID + 8 + uVar26 * 8);
                                VmValue::RemoveUse(&this->super_VmValue,pVVar27);
                                VmValue::RemoveUse(this_00,pVVar27);
                                VVar1 = pVVar27[1].type.type;
                                uVar24 = (ulong)VVar1;
                                if ((uVar24 < 2) || (uVar24 <= uVar26)) goto LAB_001a10b1;
                                VVar14 = VVar1 - VM_TYPE_DOUBLE;
                                uVar25 = (ulong)VVar14;
                                *(undefined8 *)(*(long *)&pVVar27[1].typeID + uVar26 * 8) =
                                     *(undefined8 *)(*(long *)&pVVar27[1].typeID + uVar25 * 8);
                                if (uVar24 <= uVar26 + 1) goto LAB_001a10b1;
                                *(undefined8 *)(*(long *)&pVVar27[1].typeID + 8 + uVar26 * 8) =
                                     *(undefined8 *)
                                      (*(long *)&pVVar27[1].typeID +
                                      (ulong)(VVar1 - VM_TYPE_INT) * 8);
                                pVVar27[1].type.type = VVar14;
                              }
                              uVar26 = uVar26 + 2;
                            } while (uVar26 < uVar25);
                            uVar22 = (pVVar16->super_VmValue).users.count;
                          }
                        } while (uVar22 != 0);
                        uVar21 = local_260.count;
                      }
                      (pVVar16->super_VmValue).canBeRemoved = true;
                      uVar23 = uVar23 + 1;
                    } while (uVar23 < uVar21);
                  }
                }
                module->currentFunction = (VmFunction *)0x0;
                SmallArray<VmInstruction_*,_32U>::~SmallArray(&local_260);
                SmallArray<VmValue_*,_32U>::~SmallArray(&local_148);
                SmallArray<VmInstruction_*,_32U>::~SmallArray(&local_378);
                SmallArray<VmBlock_*,_32U>::~SmallArray(&local_490);
              }
            }
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (pSVar2->allVariables).count);
      }
      VmFunction::UpdateLiveSets((VmFunction *)value,module);
    }
  }
  return;
LAB_001a113c:
  pcVar19 = "void SmallArray<VmBlock *, 32>::push_back(const T &) [T = VmBlock *, N = 32]";
  goto LAB_001a10fc;
LAB_001a1125:
  pcVar19 = 
  "void SmallArray<VmInstruction *, 32>::push_back(const T &) [T = VmInstruction *, N = 32]";
LAB_001a10fc:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar19);
}

Assistant:

void RunMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		// Skip prototypes
		if(!function->firstBlock)
			return;

		// Skip global code
		if(!function->function)
			return;

		// Prepare dominator frontier data
		function->UpdateDominatorTree(module, true);

		ScopeData *scope = function->scope;

		if(!scope)
			return;

		// Keep stores to globals
		if(scope == ctx.globalScope)
			return;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			curr->hasAssignmentForId = 0;
			curr->hasPhiNodeForId = 0;
		}

		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			assert(!IsMemberScope(variable->scope));
			assert(!IsGlobalScope(variable->scope));

			// Consider only the variables that don't have their address taken
			if(HasAddressTaken(variable))
				continue;

			// Consider only variables of simple types
			VmType vmType = GetVmType(ctx, variable->type);

			if(variable->type != ctx.typeInt && variable->type != ctx.typeDouble && variable->type != ctx.typeLong && vmType.type != VM_TYPE_POINTER)
				continue;

			// Initilize the worklist with a set of blocks that contain assignments to the variable
			SmallArray<VmBlock*, 32> worklist(module->allocator);

			// Argument is implicitly initialized in the entry block
			if(IsArgumentVariable(function->function, variable))
			{
				function->firstBlock->hasAssignmentForId = i + 1;
				worklist.push_back(function->firstBlock);
			}

			// Find all explicit assignments
			for(unsigned varUserPos = 0; varUserPos < variable->users.size(); varUserPos++)
			{
				VmConstant *user = variable->users[varUserPos];

				for(unsigned containerUserPos = 0; containerUserPos < user->users.size(); containerUserPos++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[containerUserPos]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							bool found = false;

							for(unsigned worklistPos = 0; worklistPos < worklist.size() && !found; worklistPos++)
							{
								if(worklist[worklistPos] == inst->parent)
									found = true;
							}

							if(!found)
							{
								inst->parent->hasAssignmentForId = i + 1;
								worklist.push_back(inst->parent);
							}
						}
					}
				}
			}

			module->currentFunction = function;

			// Add placeholders for required phi nodes
			SmallArray<VmInstruction*, 32> phiNodes(module->allocator);

			while(!worklist.empty())
			{
				VmBlock *block = worklist.back();
				worklist.pop_back();

				for(unsigned dfPos = 0; dfPos < block->dominanceFrontier.size(); dfPos++)
				{
					VmBlock *dominator = block->dominanceFrontier[dfPos];

					if(dominator->hasPhiNodeForId < i + 1)
					{
						// Add phi for variable
						module->currentBlock = dominator;
						dominator->insertPoint = NULL;

						VmInstruction *placeholder = CreateInstruction(module, NULL, vmType, VM_INST_PHI);

						for(unsigned predecessorPos = 0; predecessorPos < dominator->predecessors.size(); predecessorPos++)
						{
							placeholder->arguments.push_back(NULL);
							placeholder->arguments.push_back(dominator->predecessors[predecessorPos]);

							dominator->predecessors[predecessorPos]->AddUse(placeholder);
						}

						placeholder->comment = variable->name->name;

						phiNodes.push_back(placeholder);

						dominator->insertPoint = dominator->lastInstruction;
						module->currentBlock = NULL;

						dominator->hasPhiNodeForId = i + 1;

						if(dominator->hasAssignmentForId < i + 1)
						{
							dominator->hasAssignmentForId = i + 1;
							worklist.push_back(dominator);
						}
					}
				}
			}

			SmallArray<VmValue*, 32> stack(module->allocator);

			RenameMemoryToRegister(ctx, module, function->firstBlock, stack, variable, phiNodes);

			// Remove dead phi instructions (prune ssa)
			SmallArray<VmInstruction*, 32> unusedPhiNodes(module->allocator);

			for(unsigned k = 0; k < phiNodes.size(); k++)
			{
				VmInstruction *phi = phiNodes[k];

				if(!IsPhiUsed(phi, function->nextSearchMarker++))
					unusedPhiNodes.push_back(phi);
			}

			for(unsigned k = 0; k < unusedPhiNodes.size(); k++)
			{
				VmInstruction *phi = unusedPhiNodes[k];

				phi->canBeRemoved = false;

				// Remove from all phi users (since this is an unused phi node, all remaining users are circular references from other phi nodes)
				while(!phi->users.empty())
				{
					VmInstruction *user = getType<VmInstruction>(phi->users.back());

					assert(user->cmd == VM_INST_PHI);

					for(unsigned argument = 0; argument < user->arguments.size(); argument += 2)
					{
						VmValue *option = user->arguments[argument];
						VmValue *edge = user->arguments[argument + 1];

						if(option == phi)
						{
							option->RemoveUse(user);
							edge->RemoveUse(user);

							user->arguments[argument] = user->arguments[user->arguments.size() - 2];
							user->arguments[argument + 1] = user->arguments[user->arguments.size() - 1];

							user->arguments.pop_back();
							user->arguments.pop_back();
						}
					}
				}

				phi->canBeRemoved = true;
			}

			module->currentFunction = NULL;
		}

		function->UpdateLiveSets(module);
	}
}